

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory_systemv.cpp
# Opt level: O2

bool __thiscall
QSharedMemorySystemV::attach(QSharedMemorySystemV *this,QSharedMemoryPrivate *self,AccessMode mode)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QLatin1StringView function;
  QLatin1StringView function_00;
  QLatin1StringView function_01;
  shmid_ds shmid_ds;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = shmget(this->unix_key,0,(mode != ReadOnly | 2) << 7);
  if (iVar2 == -1) {
    function_00.m_data = "QSharedMemory::attach (shmget)";
    function_00.m_size = 0x1e;
    QSharedMemoryPrivate::setUnixErrorString(self,function_00);
    this->unix_key = 0;
    QByteArray::clear(&this->nativeKeyFile);
  }
  else {
    pvVar3 = shmat(iVar2,(void *)0x0,(uint)(mode == ReadOnly) << 0xc);
    self->memory = pvVar3;
    if (pvVar3 != (void *)0xffffffffffffffff) {
      shmid_ds.__glibc_reserved5 = (__syscall_ulong_t)&DAT_aaaaaaaaaaaaaaaa;
      shmid_ds.__glibc_reserved6 = (__syscall_ulong_t)&DAT_aaaaaaaaaaaaaaaa;
      shmid_ds._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
      shmid_ds.shm_nattch = (shmatt_t)&DAT_aaaaaaaaaaaaaaaa;
      shmid_ds.shm_dtime = (__time_t)&DAT_aaaaaaaaaaaaaaaa;
      shmid_ds.shm_ctime = (__time_t)&DAT_aaaaaaaaaaaaaaaa;
      shmid_ds.shm_segsz = (size_t)&DAT_aaaaaaaaaaaaaaaa;
      shmid_ds.shm_atime = (__time_t)&DAT_aaaaaaaaaaaaaaaa;
      shmid_ds.shm_perm.__glibc_reserved1 = (__syscall_ulong_t)&DAT_aaaaaaaaaaaaaaaa;
      shmid_ds.shm_perm.__glibc_reserved2 = (__syscall_ulong_t)&DAT_aaaaaaaaaaaaaaaa;
      shmid_ds.shm_perm._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      shmid_ds.shm_perm._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      shmid_ds.shm_perm._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      shmid_ds.shm_perm._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      iVar2 = shmctl(iVar2,2,(shmid_ds *)&shmid_ds);
      bVar4 = iVar2 == 0;
      if (bVar4) {
        self->size = shmid_ds.shm_segsz;
      }
      else {
        function.m_data = "QSharedMemory::attach (shmctl)";
        function.m_size = 0x1e;
        QSharedMemoryPrivate::setUnixErrorString(self,function);
      }
      goto LAB_0043bf3f;
    }
    self->memory = (void *)0x0;
    function_01.m_data = "QSharedMemory::attach (shmat)";
    function_01.m_size = 0x1d;
    QSharedMemoryPrivate::setUnixErrorString(self,function_01);
  }
  bVar4 = false;
LAB_0043bf3f:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QSharedMemorySystemV::attach(QSharedMemoryPrivate *self, QSharedMemory::AccessMode mode)
{
    // grab the shared memory segment id
    int id = shmget(unix_key, 0, (mode == QSharedMemory::ReadOnly ? 0400 : 0600));
    if (-1 == id) {
        self->setUnixErrorString("QSharedMemory::attach (shmget)"_L1);
        unix_key = 0;
        nativeKeyFile.clear();
        return false;
    }

    // grab the memory
    self->memory = shmat(id, nullptr, (mode == QSharedMemory::ReadOnly ? SHM_RDONLY : 0));
    if (self->memory == MAP_FAILED) {
        self->memory = nullptr;
        self->setUnixErrorString("QSharedMemory::attach (shmat)"_L1);
        return false;
    }

    // grab the size
    shmid_ds shmid_ds;
    if (!shmctl(id, IPC_STAT, &shmid_ds)) {
        self->size = (qsizetype)shmid_ds.shm_segsz;
    } else {
        self->setUnixErrorString("QSharedMemory::attach (shmctl)"_L1);
        return false;
    }

    return true;
}